

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable_table.cpp
# Opt level: O0

void __thiscall Variable_table::print_vars(Variable_table *this)

{
  bool bVar1;
  reference ppVVar2;
  undefined1 local_b0 [40];
  string local_88 [32];
  Variable *local_68;
  Variable *variable;
  iterator __end1;
  iterator __begin1;
  vector<Variable_*,_std::allocator<Variable_*>_> *__range1;
  allocator local_31;
  string local_30 [32];
  Variable_table *local_10;
  Variable_table *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"------ VARIABLES ------",&local_31);
  cout_log((string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  endl_log();
  __end1 = std::vector<Variable_*,_std::allocator<Variable_*>_>::begin(&this->vars);
  variable = (Variable *)std::vector<Variable_*,_std::allocator<Variable_*>_>::end(&this->vars);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Variable_**,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>
                                *)&variable);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Variable_**,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>
              ::operator*(&__end1);
    local_68 = *ppVVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"INTEGER ",(allocator *)(local_b0 + 0x27));
    cout_log((string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 0x27));
    Variable::get_name_abi_cxx11_((Variable *)local_b0);
    cout_log((string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    endl_log();
    __gnu_cxx::__normal_iterator<Variable_**,_std::vector<Variable_*,_std::allocator<Variable_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Variable_table::print_vars()
{
	cout_log("------ VARIABLES ------");
	endl_log();
	for (auto variable : vars) {
		cout_log("INTEGER ");
		cout_log(variable->get_name());
		endl_log();
	}
}